

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O2

void __thiscall
vectorgraphics::Polygon3D::Polygon3D
          (Polygon3D *this,vector<double,_std::allocator<double>_> *coordinates)

{
  pointer pdVar1;
  pointer psVar2;
  shared_ptr<vectorgraphics::Point3D> *__args_1;
  ulong uVar3;
  long lVar4;
  shared_ptr<vectorgraphics::LineSegment3D> local_48;
  vector<std::shared_ptr<vectorgraphics::Point3D>,std::allocator<std::shared_ptr<vectorgraphics::Point3D>>>
  *local_38;
  
  local_38 = (vector<std::shared_ptr<vectorgraphics::Point3D>,std::allocator<std::shared_ptr<vectorgraphics::Point3D>>>
              *)&this->point_ptrs_;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 8;
  for (uVar3 = 2;
      pdVar1 = (coordinates->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(coordinates->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 3) {
    std::make_shared<vectorgraphics::Point3D,double&,double&,double&>
              ((double *)&local_48,(double *)((long)pdVar1 + lVar4 + -8),
               (double *)((long)pdVar1 + lVar4));
    std::
    vector<std::shared_ptr<vectorgraphics::Point3D>,std::allocator<std::shared_ptr<vectorgraphics::Point3D>>>
    ::emplace_back<std::shared_ptr<vectorgraphics::Point3D>>
              (local_38,(shared_ptr<vectorgraphics::Point3D> *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.
                super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar4 = lVar4 + 0x18;
  }
  lVar4 = 0x10;
  for (uVar3 = 1;
      psVar2 = (this->point_ptrs_).
               super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      __args_1 = (shared_ptr<vectorgraphics::Point3D> *)
                 ((long)&psVar2[-1].
                         super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar4),
      uVar3 < (ulong)((long)(this->point_ptrs_).
                            super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar3 = uVar3 + 1) {
    std::
    make_shared<vectorgraphics::LineSegment3D,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
              ((shared_ptr<vectorgraphics::Point3D> *)&local_48,__args_1);
    std::
    vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
    ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment3D>>
              ((vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
                *)&this->line_segment_ptrs_,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.
                super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar4 = lVar4 + 0x10;
  }
  std::
  make_shared<vectorgraphics::LineSegment3D,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
            ((shared_ptr<vectorgraphics::Point3D> *)&local_48,__args_1);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
  ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment3D>>
            ((vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
              *)&this->line_segment_ptrs_,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

Polygon3D::Polygon3D(std::vector<double> coordinates) {
    size_t index=0;
    while(index+2 < coordinates.size()) {
      point_ptrs_.push_back(std::make_shared<Point3D>(coordinates[index], coordinates[index+1], coordinates[index+2]));
      index += 3;
    }

    index = 1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[0]));
  }